

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_fflags_text(archive_entry *entry)

{
  wchar_t wVar1;
  char *mbs;
  int *piVar2;
  char *p;
  char *f;
  archive_entry *entry_local;
  
  f = (char *)entry;
  wVar1 = archive_mstring_get_mbs(entry->archive,&entry->ae_fflags_text,&p);
  if (wVar1 == L'\0') {
    if (p != (char *)0x0) {
      return p;
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  if ((*(long *)(f + 0x130) == 0) && (*(long *)(f + 0x138) == 0)) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    mbs = ae_fflagstostr(*(unsigned_long *)(f + 0x130),*(unsigned_long *)(f + 0x138));
    if (mbs == (char *)0x0) {
      entry_local = (archive_entry *)0x0;
    }
    else {
      archive_mstring_copy_mbs((archive_mstring *)(f + 200),mbs);
      free(mbs);
      wVar1 = archive_mstring_get_mbs(*(archive **)f,(archive_mstring *)(f + 200),&p);
      if (wVar1 == L'\0') {
        entry_local = (archive_entry *)p;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          __archive_errx(1,"No memory");
        }
        entry_local = (archive_entry *)0x0;
      }
    }
  }
  return (char *)entry_local;
}

Assistant:

const char *
archive_entry_fflags_text(struct archive_entry *entry)
{
	const char *f;
	char *p;

	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0) {
		if (f != NULL)
			return (f);
	} else if (errno == ENOMEM)
		__archive_errx(1, "No memory");

	if (entry->ae_fflags_set == 0  &&  entry->ae_fflags_clear == 0)
		return (NULL);

	p = ae_fflagstostr(entry->ae_fflags_set, entry->ae_fflags_clear);
	if (p == NULL)
		return (NULL);

	archive_mstring_copy_mbs(&entry->ae_fflags_text, p);
	free(p);
	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0)
		return (f);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}